

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O3

void __thiscall
psy::C::SyntaxTree::newDiagnostic(SyntaxTree *this,DiagnosticDescriptor *descriptor,IndexType tkIdx)

{
  pointer pcVar1;
  SyntaxToken *pSVar2;
  undefined1 local_d0 [32];
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined2 local_70;
  SyntaxToken local_68;
  
  pcVar1 = (descriptor->id_)._M_dataplus._M_p;
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar1,pcVar1 + (descriptor->id_)._M_string_length);
  pcVar1 = (descriptor->title_)._M_dataplus._M_p;
  local_b0._M_p = (pointer)&local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (descriptor->title_)._M_string_length);
  pcVar1 = (descriptor->description_)._M_dataplus._M_p;
  local_90._M_p = (pointer)&local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (descriptor->description_)._M_string_length);
  local_70._0_1_ = descriptor->defaultSeverity_;
  local_70._1_1_ = descriptor->category_;
  pSVar2 = LexedTokens::tokenAt
                     (&((this->impl_)._M_t.
                        super___uniq_ptr_impl<psy::C::SyntaxTree::SyntaxTreeImpl,_std::default_delete<psy::C::SyntaxTree::SyntaxTreeImpl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_psy::C::SyntaxTree::SyntaxTreeImpl_*,_std::default_delete<psy::C::SyntaxTree::SyntaxTreeImpl>_>
                        .super__Head_base<0UL,_psy::C::SyntaxTree::SyntaxTreeImpl_*,_false>.
                       _M_head_impl)->tokens_,tkIdx);
  local_68.field_10 = pSVar2->field_10;
  local_68.tree_ = pSVar2->tree_;
  local_68.syntaxK_ = pSVar2->syntaxK_;
  local_68.byteSize_ = pSVar2->byteSize_;
  local_68.charSize_ = pSVar2->charSize_;
  local_68._14_2_ = *(undefined2 *)&pSVar2->field_0xe;
  local_68.byteOffset_ = pSVar2->byteOffset_;
  local_68.charOffset_ = pSVar2->charOffset_;
  local_68.matchingBracket_ = pSVar2->matchingBracket_;
  local_68.field_7 = pSVar2->field_7;
  local_68._34_2_ = *(undefined2 *)&pSVar2->field_0x22;
  local_68.lineno_ = pSVar2->lineno_;
  local_68.column_ = pSVar2->column_;
  local_68._44_4_ = *(undefined4 *)&pSVar2->field_0x2c;
  newDiagnostic(this,(DiagnosticDescriptor *)local_d0,&local_68);
  SyntaxToken::~SyntaxToken(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  return;
}

Assistant:

void SyntaxTree::newDiagnostic(DiagnosticDescriptor descriptor,
                               LexedTokens::IndexType tkIdx) const
{
    newDiagnostic(descriptor, tokenAt(tkIdx));
}